

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump2.cpp
# Opt level: O3

void __thiscall DumpParams::applyFormat(DumpParams *this,ostream *os)

{
  long lVar1;
  uint64_t ofs;
  uint uVar2;
  
  if (this->dumpformat == 2) {
    uVar2 = 0x80;
  }
  else {
    if (this->dumpformat != 1) goto LAB_001030cb;
    uVar2 = 0x20;
  }
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffff4f | uVar2;
LAB_001030cb:
  if ((this->summarizeThreshold).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged == true) {
    Hex::Hexdumper_base::setthreshold
              (os,(long)(this->summarizeThreshold).super__Optional_base<int,_true,_true>._M_payload.
                        super__Optional_payload_base<int>._M_payload._M_value);
  }
  lVar1 = *(long *)os;
  *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) | 0x400;
  *(long *)(os + *(long *)(lVar1 + -0x18) + 0x10) = (long)this->unitsPerLine;
  *(long *)(os + *(long *)(lVar1 + -0x18) + 8) = (long)this->dumpUnitSize;
  *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  Hex::Hexdumper_base::setstep(os,this->stepSize);
  lVar1 = *(long *)(*(long *)os + -0x18);
  if (this->summarize == true) {
    uVar2 = *(uint *)(os + lVar1 + 0x18) | 0x1000;
  }
  else {
    uVar2 = *(uint *)(os + lVar1 + 0x18) & 0xffffefff;
  }
  *(uint *)(os + lVar1 + 0x18) = uVar2;
  ofs = (this->offset).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload._M_value;
  Hex::multiline<char,std::char_traits<char>>(os);
  Hex::Hexdumper_base::setbaseofs(os,ofs);
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) | 0x400;
  return;
}

Assistant:

void applyFormat(std::ostream& os)
    {
        switch(dumpformat)
        {
            case DUMP_ASCII: os << std::right; break;
            case DUMP_HEX: os << std::left; break;
        }
        if (summarizeThreshold)
            os << Hex::summarize_threshold(*summarizeThreshold);
        
        os << std::showpoint;
        os << std::setw(unitsPerLine);
        os << std::setprecision(dumpUnitSize);
        os << std::hex;
        os << Hex::step(stepSize);
        if (summarize)
            os << std::skipws;
        else
            os << std::noskipws;
        os << Hex::offset(*offset);
    }